

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void Diligent::PipelineStateVkImpl::RemapOrVerifyShaderResources
               (TShaderStages *ShaderStages,
               RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pSignatures,
               Uint32 SignatureCount,TBindIndexToDescSetIndex *BindIndexToDescSetIndex,
               bool bVerifyOnly,bool bStripReflection,char *PipelineName,
               TShaderResources *pDvpShaderResources,TResourceAttibutions *pDvpResourceAttibutions)

{
  ShaderVkImpl *pSVar1;
  bool bVar2;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> *pvVar3;
  reference pvVar4;
  reference pvVar5;
  char (*pacVar6) [32];
  char (*Args_1) [32];
  Char *pCVar7;
  ShaderVkImpl *Args_1_00;
  const_reference ppSVar8;
  reference SrcSPIRV;
  element_type *peVar9;
  ShaderDesc *Args_1_01;
  undefined1 local_128 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> StrippedSPIRV;
  undefined1 auStack_108 [4];
  SPIRV_OPTIMIZATION_FLAGS OptimizationFlags;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> **local_100;
  Uint32 *local_f8;
  ShaderVkImpl **local_f0;
  char **local_e8;
  TBindIndexToDescSetIndex *local_e0;
  bool *local_d8;
  reference local_d0;
  TResourceAttibutions **local_c8;
  undefined1 local_c0 [8];
  string msg_1;
  shared_ptr<const_Diligent::SPIRVShaderResources> *pShaderResources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *SPIRV;
  ShaderVkImpl *pShader;
  size_t i;
  undefined1 local_70 [8];
  string msg;
  SHADER_TYPE ShaderType;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *SPIRVs;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> *Shaders;
  size_t s;
  bool bStripReflection_local;
  TBindIndexToDescSetIndex *pTStack_28;
  bool bVerifyOnly_local;
  TBindIndexToDescSetIndex *BindIndexToDescSetIndex_local;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pRStack_18;
  Uint32 SignatureCount_local;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pSignatures_local;
  TShaderStages *ShaderStages_local;
  
  if (PipelineName == (char *)0x0) {
    PipelineName = "<null>";
  }
  s._6_1_ = bStripReflection;
  s._7_1_ = bVerifyOnly;
  pTStack_28 = BindIndexToDescSetIndex;
  BindIndexToDescSetIndex_local._4_4_ = SignatureCount;
  pRStack_18 = pSignatures;
  pSignatures_local = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)ShaderStages;
  for (Shaders = (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  *)0x0;
      pvVar3 = (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                *)std::
                  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                  ::size((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                          *)pSignatures_local), Shaders < pvVar3;
      Shaders = (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 *)((long)&(Shaders->
                           super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar4 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[]((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                           *)pSignatures_local,(size_type)Shaders);
    pvVar3 = &pvVar4->Shaders;
    pvVar4 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[]((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                           *)pSignatures_local,(size_type)Shaders);
    pvVar5 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[]((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                           *)pSignatures_local,(size_type)Shaders);
    msg.field_2._12_4_ = pvVar5->Type;
    pacVar6 = (char (*) [32])
              std::
              vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              ::size(pvVar3);
    Args_1 = (char (*) [32])
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::size(&pvVar4->SPIRVs);
    if (pacVar6 != Args_1) {
      FormatString<char[26],char[32]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"RemapOrVerifyShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x2a5);
      std::__cxx11::string::~string((string *)local_70);
    }
    for (pShader = (ShaderVkImpl *)0x0; pSVar1 = pShader,
        Args_1_00 = (ShaderVkImpl *)
                    std::
                    vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                    ::size(pvVar3), pSVar1 < Args_1_00;
        pShader = (ShaderVkImpl *)
                  ((long)&(pShader->super_ShaderBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                          .super_ObjectBase<Diligent::IShaderVk>.
                          super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.super_IShader.
                          super_IDeviceObject + 1)) {
      ppSVar8 = std::
                vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                ::operator[](pvVar3,(size_type)pShader);
      SPIRV = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*ppSVar8;
      SrcSPIRV = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&pvVar4->SPIRVs,(size_type)pShader);
      msg_1.field_2._8_8_ = ShaderVkImpl::GetShaderResources((ShaderVkImpl *)SPIRV);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)msg_1.field_2._8_8_);
      if (!bVar2) {
        FormatString<char[26],char[17]>
                  ((string *)local_c0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pShaderResources",(char (*) [17])Args_1_00);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"RemapOrVerifyShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x2ad);
        std::__cxx11::string::~string((string *)local_c0);
      }
      if (pDvpShaderResources != (TShaderResources *)0x0) {
        std::
        vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>
        ::emplace_back<std::shared_ptr<Diligent::SPIRVShaderResources_const>const&>
                  ((vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>
                    *)pDvpShaderResources,
                   (shared_ptr<const_Diligent::SPIRVShaderResources> *)msg_1.field_2._8_8_);
      }
      peVar9 = std::
               __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)msg_1.field_2._8_8_);
      _auStack_108 = (SHADER_TYPE *)((long)&msg.field_2 + 0xc);
      local_100 = &stack0xffffffffffffffe8;
      local_f8 = (Uint32 *)((long)&BindIndexToDescSetIndex_local + 4);
      local_f0 = (ShaderVkImpl **)&SPIRV;
      local_e8 = &PipelineName;
      local_e0 = pTStack_28;
      local_d8 = (bool *)((long)&s + 7);
      local_c8 = &pDvpResourceAttibutions;
      local_d0 = SrcSPIRV;
      SPIRVShaderResources::
      ProcessResources<Diligent::PipelineStateVkImpl::RemapOrVerifyShaderResources(std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>&,Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>const*,unsigned_int,std::array<unsigned_int,8ul>const&,bool,bool,char_const*,std::vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>*,std::vector<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>>*)::__0>
                (peVar9,(anon_class_72_9_cbe7f86d *)auStack_108);
      if ((s._6_1_ & 1) != 0) {
        StrippedSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION;
        peVar9 = std::
                 __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)msg_1.field_2._8_8_);
        bVar2 = SPIRVShaderResources::IsHLSLSource(peVar9);
        if (bVar2) {
          Diligent::operator|=
                    ((SPIRV_OPTIMIZATION_FLAGS *)
                     ((long)&StrippedSPIRV.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage + 4),
                     SPIRV_OPTIMIZATION_FLAG_LEGALIZATION);
        }
        OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_128,SrcSPIRV,
                      SPV_ENV_MAX,
                      StrippedSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_128);
        if (bVar2) {
          Args_1_01 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                      ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                                 *)SPIRV);
          LogError<false,char[53],char_const*,char[51]>
                    (false,"RemapOrVerifyShaderResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                     ,0x30c,(char (*) [53])"Failed to strip reflection information from shader \'",
                     (char **)Args_1_01,
                     (char (*) [51])"\'. This may indicate a problem with the byte code.");
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (SrcSPIRV,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_128);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_128);
      }
    }
  }
  return;
}

Assistant:

void PipelineStateVkImpl::RemapOrVerifyShaderResources(
    TShaderStages&                                       ShaderStages,
    const RefCntAutoPtr<PipelineResourceSignatureVkImpl> pSignatures[],
    const Uint32                                         SignatureCount,
    const TBindIndexToDescSetIndex&                      BindIndexToDescSetIndex,
    bool                                                 bVerifyOnly,
    bool                                                 bStripReflection,
    const char*                                          PipelineName,
    TShaderResources*                                    pDvpShaderResources,
    TResourceAttibutions*                                pDvpResourceAttibutions) noexcept(false)
{
    if (PipelineName == nullptr)
        PipelineName = "<null>";

    // Verify that pipeline layout is compatible with shader resources and
    // remap resource bindings.
    for (size_t s = 0; s < ShaderStages.size(); ++s)
    {
        const std::vector<const ShaderVkImpl*>& Shaders    = ShaderStages[s].Shaders;
        std::vector<std::vector<uint32_t>>&     SPIRVs     = ShaderStages[s].SPIRVs;
        const SHADER_TYPE                       ShaderType = ShaderStages[s].Type;

        VERIFY_EXPR(Shaders.size() == SPIRVs.size());

        for (size_t i = 0; i < Shaders.size(); ++i)
        {
            const ShaderVkImpl*    pShader = Shaders[i];
            std::vector<uint32_t>& SPIRV   = SPIRVs[i];

            const auto& pShaderResources = pShader->GetShaderResources();
            VERIFY_EXPR(pShaderResources);

            if (pDvpShaderResources)
                pDvpShaderResources->emplace_back(pShaderResources);

            pShaderResources->ProcessResources(
                [&](const SPIRVShaderResourceAttribs& SPIRVAttribs, Uint32) //
                {
                    const ResourceAttribution ResAttribution = GetResourceAttribution(SPIRVAttribs.Name, ShaderType, pSignatures, SignatureCount);
                    if (!ResAttribution)
                    {
                        LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' contains resource '", SPIRVAttribs.Name,
                                            "' that is not present in any pipeline resource signature used to create pipeline state '",
                                            PipelineName, "'.");
                    }

                    const PipelineResourceSignatureDesc& SignDesc = ResAttribution.pSignature->GetDesc();
                    const SHADER_RESOURCE_TYPE           ResType  = SPIRVShaderResourceAttribs::GetShaderResourceType(SPIRVAttribs.Type);
                    const PIPELINE_RESOURCE_FLAGS        Flags    = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(SPIRVAttribs.Type);

                    Uint32 ResourceBinding = ~0u;
                    Uint32 DescriptorSet   = ~0u;
                    if (ResAttribution.ResourceIndex != ResourceAttribution::InvalidResourceIndex)
                    {
                        const PipelineResourceDesc& ResDesc = ResAttribution.pSignature->GetResourceDesc(ResAttribution.ResourceIndex);
                        ValidatePipelineResourceCompatibility(ResDesc, ResType, Flags, SPIRVAttribs.ArraySize,
                                                              pShader->GetDesc().Name, SignDesc.Name);

                        const PipelineResourceSignatureVkImpl::ResourceAttribs& ResAttribs{ResAttribution.pSignature->GetResourceAttribs(ResAttribution.ResourceIndex)};
                        ResourceBinding = ResAttribs.BindingIndex;
                        DescriptorSet   = ResAttribs.DescrSet;
                    }
                    else if (ResAttribution.ImmutableSamplerIndex != ResourceAttribution::InvalidResourceIndex)
                    {
                        if (ResType != SHADER_RESOURCE_TYPE_SAMPLER)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' contains resource with name '", SPIRVAttribs.Name,
                                                "' and type '", GetShaderResourceTypeLiteralName(ResType),
                                                "' that is not compatible with immutable sampler defined in pipeline resource signature '",
                                                SignDesc.Name, "'.");
                        }
                        const ImmutableSamplerAttribsVk& SamAttribs{ResAttribution.pSignature->GetImmutableSamplerAttribs(ResAttribution.ImmutableSamplerIndex)};
                        ResourceBinding = SamAttribs.BindingIndex;
                        DescriptorSet   = SamAttribs.DescrSet;
                    }
                    else
                    {
                        UNEXPECTED("Either immutable sampler or resource index should be valid");
                    }

                    VERIFY_EXPR(ResourceBinding != ~0u && DescriptorSet != ~0u);
                    DescriptorSet += BindIndexToDescSetIndex[SignDesc.BindingIndex];
                    if (bVerifyOnly)
                    {
                        const Uint32 SpvBinding  = SPIRV[SPIRVAttribs.BindingDecorationOffset];
                        const Uint32 SpvDescrSet = SPIRV[SPIRVAttribs.DescriptorSetDecorationOffset];
                        if (SpvBinding != ResourceBinding)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' maps resource '", SPIRVAttribs.Name,
                                                "' to binding ", SpvBinding, ", but the same resource in pipeline resource signature '",
                                                SignDesc.Name, "' is mapped to binding ", ResourceBinding, '.');
                        }
                        if (SpvDescrSet != DescriptorSet)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' maps resource '", SPIRVAttribs.Name,
                                                "' to descriptor set ", SpvDescrSet, ", but the same resource in pipeline resource signature '",
                                                SignDesc.Name, "' is mapped to set ", DescriptorSet, '.');
                        }
                    }
                    else
                    {
                        SPIRV[SPIRVAttribs.BindingDecorationOffset]       = ResourceBinding;
                        SPIRV[SPIRVAttribs.DescriptorSetDecorationOffset] = DescriptorSet;
                    }

                    if (pDvpResourceAttibutions)
                        pDvpResourceAttibutions->emplace_back(ResAttribution);
                });

            if (bStripReflection)
            {
#if !DILIGENT_NO_HLSL
                // We have to strip reflection instructions to fix the following validation error:
                //     SPIR-V module not valid: DecorateStringGOOGLE requires one of the following extensions: SPV_GOOGLE_decorate_string
                // Optimizer also performs validation and may catch problems with the byte code.
                // NB: SPIRV offsets become INVALID after this operation.
                SPIRV_OPTIMIZATION_FLAGS OptimizationFlags = SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION;
                if (pShaderResources->IsHLSLSource())
                {
                    OptimizationFlags |= SPIRV_OPTIMIZATION_FLAG_LEGALIZATION;
                }
                std::vector<uint32_t> StrippedSPIRV = OptimizeSPIRV(SPIRV, SPV_ENV_MAX, OptimizationFlags);
                if (!StrippedSPIRV.empty())
                    SPIRV = std::move(StrippedSPIRV);
                else
                    LOG_ERROR("Failed to strip reflection information from shader '", pShader->GetDesc().Name, "'. This may indicate a problem with the byte code.");
#endif
            }
        }
    }
}